

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

string * __thiscall
tinyusdz::PrimMetas::get_kind_abi_cxx11_(string *__return_storage_ptr__,PrimMetas *this)

{
  value_type *pvVar1;
  Kind v;
  allocator local_19;
  
  if ((this->kind).has_value_ == true) {
    pvVar1 = nonstd::optional_lite::optional<tinyusdz::Kind>::value(&this->kind);
    if (*pvVar1 == UserDef) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_kind_str);
    }
    else {
      pvVar1 = nonstd::optional_lite::optional<tinyusdz::Kind>::value(&this->kind);
      tinyusdz::to_string_abi_cxx11_(__return_storage_ptr__,(tinyusdz *)(ulong)*pvVar1,v);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string PrimMeta::get_kind() const {

  if (kind.has_value()) {
    if (kind.value() == Kind::UserDef) {
      return _kind_str;
    } else {
      return to_string(kind.value());
    }
  }

  return "";
}